

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuasispeciesEdgeCalculator.cpp
# Opt level: O0

float __thiscall
QuasispeciesEdgeCalculator::overlapSize
          (QuasispeciesEdgeCalculator *this,int e1,int e2,int s1,int s2)

{
  int s2_local;
  int s1_local;
  int e2_local;
  int e1_local;
  QuasispeciesEdgeCalculator *this_local;
  undefined4 local_4;
  
  if ((s1 == s2) && (e1 == e2)) {
    local_4 = (float)(e1 - s1);
  }
  else if (s1 == s2) {
    if (e1 < e2) {
      local_4 = (float)(e1 - s1);
    }
    else {
      local_4 = (float)(e2 - s2);
    }
  }
  else if (e1 == e2) {
    if (s2 < s1) {
      local_4 = (float)(e1 - s1);
    }
    else {
      local_4 = (float)(e2 - s2);
    }
  }
  else if (e1 < e2) {
    if (s1 < s2) {
      local_4 = (float)(e1 - s2);
    }
    else {
      local_4 = (float)(e1 - s1);
    }
  }
  else if (s2 < s1) {
    local_4 = (float)(e2 - s1);
  }
  else {
    local_4 = (float)(e2 - s2);
  }
  return local_4;
}

Assistant:

float QuasispeciesEdgeCalculator::overlapSize(int e1, int e2, int s1, int s2) const {
    if (s1 == s2 && e1 == e2) {
        // -----
        // -----
        return e1 - s1;
    } else if (s1 == s2) {
        // ----  AND -----
        // ----- AND ----
        if (e1 < e2) {
            return e1 - s1;
        } else {
            return e2 - s2;
        }
    } else if (e1 == e2) {
        //  ---- AND -----
        // ----- AND  ----
        if (s1 > s2) {
            return e1 - s1;
        } else {
            return e2 - s2;
        }
    } else if (e1 < e2) {
        // ----    AND   --
        //   ----  AND ------
        if (s1 < s2) {
            // ----
            //   ----
            return e1 - s2;
        } else {
            //   --
            // ------
            return e1 - s1;
        }
    } else {
        //   ---- AND ------
        // ----   AND   --
        if (s2 < s1) {
            //   ----
            // ----
            return e2 - s1;
        } else {
            // ------
            //   --
            return e2 - s2;
        }
    }
}